

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnseenSlotRequestListView.cpp
# Opt level: O2

vector<Slot,_std::allocator<Slot>_> * __thiscall
UnseenSlotRequestListView::getQueryset(UnseenSlotRequestListView *this)

{
  pointer pSVar1;
  int iVar2;
  _Base_ptr p_Var3;
  vector<Slot,_std::allocator<Slot>_> *this_00;
  
  pSVar1 = (this->super_ListView<Slot>).super_MultipleObjectMixin<Slot>.objects.
           super__Vector_base<Slot,_std::allocator<Slot>_>._M_impl.super__Vector_impl_data._M_start;
  if ((this->super_ListView<Slot>).super_MultipleObjectMixin<Slot>.objects.
      super__Vector_base<Slot,_std::allocator<Slot>_>._M_impl.super__Vector_impl_data._M_finish !=
      pSVar1) {
    (this->super_ListView<Slot>).super_MultipleObjectMixin<Slot>.objects.
    super__Vector_base<Slot,_std::allocator<Slot>_>._M_impl.super__Vector_impl_data._M_finish =
         pSVar1;
  }
  this_00 = &(this->super_ListView<Slot>).super_MultipleObjectMixin<Slot>.objects;
  for (p_Var3 = Model<Slot>::objectList._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &Model<Slot>::objectList._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    iVar2 = Slot::getApproved((Slot *)&p_Var3[1]._M_parent);
    if (iVar2 == 0) {
      std::vector<Slot,_std::allocator<Slot>_>::push_back
                (this_00,(value_type *)&p_Var3[1]._M_parent);
    }
  }
  return this_00;
}

Assistant:

vector<Slot> &UnseenSlotRequestListView::getQueryset() {
    objects.clear();
    for (auto &i : objectList) {
        if (i.second.getApproved() == 0) objects.push_back(i.second);
    }
    return objects;
}